

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_unittest.cpp
# Opt level: O0

void __thiscall
AtomicUnitTest_increment_Test::~AtomicUnitTest_increment_Test(AtomicUnitTest_increment_Test *this)

{
  AtomicUnitTest_increment_Test *this_local;
  
  ~AtomicUnitTest_increment_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(AtomicUnitTest, increment)
{
    using atomic_int = estl::atomic<int>;
    atomic_int a(2);
    EXPECT_EQ(2, a);
    a++;
    EXPECT_EQ(3, a);
    ++a;
    EXPECT_EQ(4, a);

    a += 5;
    EXPECT_EQ(9, a);
}